

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall
choc::value::Type::AllocatedVector<choc::value::MemberNameAndType>::~AllocatedVector
          (AllocatedVector<choc::value::MemberNameAndType> *this)

{
  uint local_14;
  uint32_t i;
  AllocatedVector<choc::value::MemberNameAndType> *this_local;
  
  for (local_14 = 0; local_14 < this->size; local_14 = local_14 + 1) {
    MemberNameAndType::~MemberNameAndType(this->items + local_14);
  }
  anon_unknown_15::freeBytes(this->allocator,this->items);
  return;
}

Assistant:

~AllocatedVector() noexcept
    {
        for (decltype (size) i = 0; i < size; ++i)
            items[i].~ObjectType();

        freeBytes (allocator, items);
    }